

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O0

void __thiscall higan::HttpResponse::HttpResponse(HttpResponse *this,bool close_connection)

{
  bool close_connection_local;
  HttpResponse *this_local;
  
  this->close_connection_ = close_connection;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->header_map_);
  Buffer::Buffer(&this->body_buffer_);
  std::shared_ptr<higan::FileForRead>::shared_ptr(&this->file_ptr_);
  return;
}

Assistant:

HttpResponse::HttpResponse(bool close_connection):
	close_connection_(close_connection),
	body_buffer_(),
	file_ptr_()
{
}